

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O3

int check_ecdsa(u8 *Q,u8 *R,u8 *S,u8 *hash,int isSHA256)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int j;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  u8 r1 [60];
  u8 Sinv [30];
  u8 w2 [30];
  u8 w1 [30];
  u8 r2 [60];
  undefined8 local_138;
  undefined2 uStack_130;
  undefined4 uStack_12e;
  undefined2 uStack_12a;
  undefined2 uStack_128;
  undefined4 uStack_126;
  undefined4 uStack_122;
  undefined4 local_11e;
  byte local_118 [64];
  u8 local_d8 [32];
  u8 local_b8 [32];
  u8 local_98 [32];
  u8 local_78 [72];
  
  bn_inv(local_d8,S,ec_N,0x1e);
  auVar4 = _DAT_00104020;
  auVar3 = _DAT_00104010;
  local_138 = 0;
  uStack_130 = 0;
  if (isSHA256 == 0) {
    local_11e = *(undefined4 *)(hash + 0x10);
    uVar2 = *(undefined8 *)hash;
    uStack_12e = (undefined4)uVar2;
    uStack_12a = (undefined2)((ulong)uVar2 >> 0x20);
    uStack_128 = (undefined2)((ulong)uVar2 >> 0x30);
    uStack_126 = (undefined4)*(undefined8 *)(hash + 8);
    uStack_122 = (undefined4)((ulong)*(undefined8 *)(hash + 8) >> 0x20);
  }
  else {
    iVar5 = 0;
    do {
      lVar8 = 0;
      auVar11 = (undefined1  [16])0x0;
      do {
        auVar1 = *(undefined1 (*) [16])(hash + lVar8);
        auVar12._0_8_ = auVar1._0_8_ << 8;
        auVar12._8_8_ = auVar1._8_8_ << 8 | auVar1._0_8_ >> 0x38;
        auVar13._0_2_ = auVar1._0_2_ >> 1;
        auVar13._2_2_ = auVar1._2_2_ >> 1;
        auVar13._4_2_ = auVar1._4_2_ >> 1;
        auVar13._6_2_ = auVar1._6_2_ >> 1;
        auVar13._8_2_ = auVar1._8_2_ >> 1;
        auVar13._10_2_ = auVar1._10_2_ >> 1;
        auVar13._12_2_ = auVar1._12_2_ >> 1;
        auVar13._14_2_ = auVar1._14_2_ >> 1;
        auVar11 = psllw(auVar11 >> 0x78 | auVar12,7);
        *(undefined1 (*) [16])(hash + lVar8) = auVar11 & auVar4 | auVar13 & auVar3;
        lVar8 = lVar8 + 0x10;
        auVar11 = auVar1;
      } while (lVar8 != 0x20);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 7);
    local_138 = *(undefined8 *)hash;
    uVar2 = *(undefined8 *)(hash + 8);
    uStack_128 = (undefined2)((ulong)*(undefined8 *)(hash + 0xe) >> 0x10);
    uStack_126 = (undefined4)((ulong)*(undefined8 *)(hash + 0xe) >> 0x20);
    uStack_122 = (undefined4)*(undefined8 *)(hash + 0x16);
    local_11e = (undefined4)((ulong)*(undefined8 *)(hash + 0x16) >> 0x20);
    uStack_130 = (undefined2)uVar2;
    uStack_12e = (undefined4)((ulong)uVar2 >> 0x10);
    uStack_12a = (undefined2)((ulong)uVar2 >> 0x30);
  }
  bn_mul(local_98,(u8 *)&local_138,local_d8,ec_N,0x1e);
  bn_mul(local_b8,R,local_d8,ec_N,0x1e);
  point_mul(local_118,local_98,ec_G);
  point_mul(local_78,local_b8,Q);
  point_add(local_118,local_118,local_78);
  lVar8 = 0;
  do {
    if (local_118[lVar8] < ec_N[lVar8]) goto LAB_001026e8;
  } while ((local_118[lVar8] <= ec_N[lVar8]) && (bVar10 = lVar8 != 0x1d, lVar8 = lVar8 + 1, bVar10))
  ;
  uVar7 = 0;
  uVar6 = 0x1d;
  do {
    uVar9 = ec_N[uVar6] + uVar7;
    uVar7 = (uint)(local_118[uVar6] < uVar9);
    local_118[uVar6] = local_118[uVar6] - (char)uVar9;
    uVar6 = uVar6 - 1;
  } while (uVar6 < 0x1e);
LAB_001026e8:
  lVar8 = 0;
  do {
    if (local_118[lVar8] != R[lVar8]) {
      return 0;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x1e);
  return 1;
}

Assistant:

int check_ecdsa(u8 *Q, u8 *R, u8 *S, u8 *hash, int isSHA256)
{
	u8 Sinv[30];
	u8 e[30];
	u8 w1[30], w2[30];
	u8 r1[60], r2[60];

	bn_inv(Sinv, S, ec_N, 30);

	elt_zero(e);

	if (isSHA256)
	{
		bn_shiftr(hash, 32, 7);  //shift right 7 bits.
		memcpy(e, hash, 30);     //then shift 16 more bits right by cutting off the last two bytes of 32 byte sha256.
    	                         //this gets our bignum sha256 hash to fit in the 233 bit limit of this ecdsa curve.
	}
	else
	{
		// Simon - New addition: added support for SHA1, very insecure as top 80 bits are always zeroes
		memcpy(e + 10, hash, 20);
	}

	bn_mul(w1, e, Sinv, ec_N, 30);
	bn_mul(w2, R, Sinv, ec_N, 30);

	point_mul(r1, w1, ec_G);
	point_mul(r2, w2, Q);

	point_add(r1, r1, r2);

	if (bn_compare(r1, ec_N, 30) >= 0)
		bn_sub_modulus(r1, ec_N, 30);

	return (bn_compare(r1, R, 30) == 0);
}